

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O1

int VP8DecodeMB(VP8Decoder *dec,VP8BitReader *token_br)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  VP8MB *pVVar4;
  VP8FInfo *pVVar5;
  VP8MBData *pVVar6;
  bool bVar7;
  uint8_t uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  VP8MBData *pVVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  byte bVar18;
  long lVar19;
  uint uVar20;
  VP8BandProbas *(*papVVar21) [17];
  uint uVar22;
  byte bVar23;
  uint uVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  VP8MBData *__s;
  long lVar28;
  int16_t dc [16];
  short local_58 [20];
  
  pVVar4 = dec->mb_info;
  iVar3 = dec->mb_x;
  __s = dec->mb_data + iVar3;
  if ((dec->use_skip_proba == 0) || (__s->skip == '\0')) {
    bVar2 = __s->segment;
    iVar9 = 0;
    memset(__s,0,0x300);
    if (__s->is_i4x4 == '\0') {
      local_58[8] = 0;
      local_58[9] = 0;
      local_58[10] = 0;
      local_58[0xb] = 0;
      local_58[0xc] = 0;
      local_58[0xd] = 0;
      local_58[0xe] = 0;
      local_58[0xf] = 0;
      local_58[0] = 0;
      local_58[1] = 0;
      local_58[2] = 0;
      local_58[3] = 0;
      local_58[4] = 0;
      local_58[5] = 0;
      local_58[6] = 0;
      local_58[7] = 0;
      iVar9 = (*GetCoeffs)(token_br,(dec->proba).bands_ptr[1],
                           (uint)pVVar4[-1].nz_dc + (uint)pVVar4[iVar3].nz_dc,dec->dqm[bVar2].y2_mat
                           ,0,local_58);
      pVVar4[-1].nz_dc = 0 < iVar9;
      pVVar4[iVar3].nz_dc = 0 < iVar9;
      if (iVar9 < 2) {
        uVar16 = 0xfffffffffffffff0;
        do {
          __s->coeffs[uVar16 + 0x10] = (int16_t)((int)local_58[0] + 3U >> 3);
          uVar16 = uVar16 + 0x10;
        } while (uVar16 < 0xf0);
      }
      else {
        (*VP8TransformWHT)(local_58,__s->coeffs);
      }
      papVVar21 = (dec->proba).bands_ptr;
      iVar9 = 1;
    }
    else {
      papVVar21 = (dec->proba).bands_ptr + 3;
    }
    bVar18 = pVVar4[iVar3].nz & 0xf;
    bVar23 = pVVar4[-1].nz & 0xf;
    uVar11 = 0;
    iVar17 = 0;
    pVVar6 = __s;
    do {
      pVVar13 = pVVar6;
      bVar7 = (bool)(bVar23 & 1);
      lVar28 = 0;
      uVar27 = 0;
      do {
        iVar10 = (*GetCoeffs)(token_br,*papVVar21,(uint)(bVar18 & 1) + (uint)bVar7,
                              dec->dqm[bVar2].y1_mat,iVar9,
                              (int16_t *)((long)pVVar13->coeffs + lVar28));
        bVar7 = iVar9 < iVar10;
        bVar18 = bVar18 >> 1 | bVar7 << 7;
        uVar22 = (uint)(*(short *)((long)pVVar13->coeffs + lVar28) != 0);
        if (1 < iVar10) {
          uVar22 = 2;
        }
        if (3 < iVar10) {
          uVar22 = 3;
        }
        uVar27 = uVar22 + uVar27 * 4;
        lVar28 = lVar28 + 0x20;
      } while ((int)lVar28 != 0x80);
      bVar18 = bVar18 >> 4;
      bVar23 = bVar7 << 7 | bVar23 >> 1;
      uVar11 = uVar11 << 8 | uVar27;
      iVar17 = iVar17 + 1;
      pVVar6 = (VP8MBData *)((long)pVVar13->coeffs + lVar28);
    } while (iVar17 != 4);
    uVar24 = (uint)bVar18;
    uVar22 = (uint)(bVar23 >> 4);
    lVar28 = (long)pVVar13->coeffs + lVar28;
    uVar27 = 0;
    iVar9 = 0;
    do {
      bVar18 = (byte)iVar9;
      uVar26 = (uint)(pVVar4[iVar3].nz >> (bVar18 & 0x1f | 4));
      uVar20 = (uint)(pVVar4[-1].nz >> (bVar18 & 0x1f | 4));
      iVar10 = 0;
      iVar17 = 0;
      do {
        lVar25 = lVar28;
        uVar14 = uVar20 & 1;
        lVar19 = 0;
        do {
          iVar12 = (*GetCoeffs)(token_br,(dec->proba).bands_ptr[2],(uVar26 & 1) + uVar14,
                                dec->dqm[bVar2].uv_mat,0,(int16_t *)(lVar25 + lVar19));
          uVar14 = (uint)(0 < iVar12);
          uVar26 = (uint)(0 < iVar12) * 8 | uVar26 >> 1;
          uVar15 = (uint)(*(short *)(lVar25 + lVar19) != 0);
          if (1 < iVar12) {
            uVar15 = 2;
          }
          if (3 < iVar12) {
            uVar15 = 3;
          }
          iVar10 = uVar15 + iVar10 * 4;
          lVar19 = lVar19 + 0x20;
        } while ((int)lVar19 == 0x20);
        uVar26 = uVar26 >> 2;
        uVar14 = uVar20 >> 1;
        uVar15 = (uint)(0 < iVar12) << 5;
        uVar20 = uVar15 | uVar14;
        bVar7 = iVar17 == 0;
        lVar28 = lVar25 + lVar19;
        iVar17 = iVar17 + 1;
      } while (bVar7);
      uVar27 = uVar27 | iVar10 << (bVar18 * '\x04' & 0x1f);
      uVar24 = uVar24 | (uVar26 << 4) << (bVar18 & 0x1f);
      uVar22 = uVar22 | (uVar15 | uVar14 & 0x70) << (bVar18 & 0x1f);
      lVar28 = lVar25 + lVar19;
      bVar7 = iVar9 == 0;
      iVar9 = iVar9 + 2;
    } while (bVar7);
    pVVar4[iVar3].nz = (uint8_t)uVar24;
    pVVar4[-1].nz = (uint8_t)uVar22;
    __s->non_zero_y = uVar11;
    __s->non_zero_uv = uVar27;
    if ((uVar27 & 0xaaaa) == 0) {
      uVar8 = (uint8_t)dec->dqm[bVar2].dither;
    }
    else {
      uVar8 = '\0';
    }
    __s->dither = uVar8;
    bVar7 = uVar27 != 0 || uVar11 != 0;
  }
  else {
    pVVar4[iVar3].nz = '\0';
    pVVar4[-1].nz = '\0';
    if (__s->is_i4x4 == '\0') {
      pVVar4[iVar3].nz_dc = '\0';
      pVVar4[-1].nz_dc = '\0';
    }
    __s->dither = '\0';
    __s->non_zero_y = 0;
    __s->non_zero_uv = 0;
    bVar7 = false;
  }
  if (0 < dec->filter_type) {
    pVVar5 = dec->f_info;
    iVar3 = dec->mb_x;
    pVVar5[iVar3] = dec->fstrengths[__s->segment][__s->is_i4x4];
    puVar1 = &pVVar5[iVar3].f_inner;
    *puVar1 = *puVar1 | bVar7;
  }
  return (int)(token_br->eof == 0);
}

Assistant:

int VP8DecodeMB(VP8Decoder* const dec, VP8BitReader* const token_br) {
  VP8MB* const left = dec->mb_info - 1;
  VP8MB* const mb = dec->mb_info + dec->mb_x;
  VP8MBData* const block = dec->mb_data + dec->mb_x;
  int skip = dec->use_skip_proba ? block->skip : 0;

  if (!skip) {
    skip = ParseResiduals(dec, mb, token_br);
  } else {
    left->nz = mb->nz = 0;
    if (!block->is_i4x4) {
      left->nz_dc = mb->nz_dc = 0;
    }
    block->non_zero_y = 0;
    block->non_zero_uv = 0;
    block->dither = 0;
  }

  if (dec->filter_type > 0) {  // store filter info
    VP8FInfo* const finfo = dec->f_info + dec->mb_x;
    *finfo = dec->fstrengths[block->segment][block->is_i4x4];
    finfo->f_inner |= !skip;
  }

  return !token_br->eof;
}